

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_visit_crossing_edge_pairs.cc
# Opt level: O2

void s2shapeutil::InitLoopError
               (Code code,char *format,ChainPosition ap,ChainPosition bp,bool is_polygon,
               S2Error *error)

{
  undefined7 in_register_00000081;
  undefined8 local_40 [4];
  
  S2Error::Init(error,code,format,(ulong)ap >> 0x20,(ulong)bp >> 0x20);
  if ((int)CONCAT71(in_register_00000081,is_polygon) != 0) {
    std::__cxx11::string::string((string *)local_40,(string *)&error->text_);
    S2Error::Init(error,code,"Loop %d: %s",(ulong)ap & 0xffffffff,local_40[0]);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

static void InitLoopError(S2Error::Code code, const char* format,
                          ChainPosition ap, ChainPosition bp,
                          bool is_polygon, S2Error* error) {
  error->Init(code, format, ap.offset, bp.offset);
  if (is_polygon) {
    error->Init(code, "Loop %d: %s", ap.chain_id, error->text().c_str());
  }
}